

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O2

void ParseScripts(void)

{
  hash_t hVar1;
  uint lump;
  int iVar2;
  long *yyp;
  char *__filename;
  FILE *pFVar3;
  ZCCParseState *pZVar4;
  uint i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ZCCToken yyminor;
  undefined1 local_a10 [12];
  int lastlump;
  FILE *local_a00;
  PSymbolTable symtable;
  ZCCCompiler cc;
  TokenMapEntry tme;
  FScanner sc;
  
  hVar1 = TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::CountUsed
                    (&TokenMap);
  if (hVar1 == 0) {
    tme.TokenType = 1;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3d,&tme);
    BackTokenMap[1] = 0x3d;
    tme.TokenType = 2;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x110,&tme);
    BackTokenMap[2] = 0x110;
    tme.TokenType = 3;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x111,&tme);
    BackTokenMap[3] = 0x111;
    tme.TokenType = 4;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x112,&tme);
    BackTokenMap[4] = 0x112;
    tme.TokenType = 5;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10e,&tme);
    BackTokenMap[5] = 0x10e;
    tme.TokenType = 6;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10f,&tme);
    BackTokenMap[6] = 0x10f;
    tme.TokenType = 7;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10d,&tme);
    BackTokenMap[7] = 0x10d;
    tme.TokenType = 8;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10b,&tme);
    BackTokenMap[8] = 0x10b;
    tme.TokenType = 0xc;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10c,&tme);
    BackTokenMap[0xc] = 0x10c;
    tme.TokenType = 9;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x113,&tme);
    BackTokenMap[9] = 0x113;
    tme.TokenType = 10;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x115,&tme);
    BackTokenMap[10] = 0x115;
    tme.TokenType = 0xb;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x114,&tme);
    BackTokenMap[0xb] = 0x114;
    tme.TokenType = 0xd;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3f,&tme);
    BackTokenMap[0xd] = 0x3f;
    tme.TokenType = 0xe;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3a,&tme);
    BackTokenMap[0xe] = 0x3a;
    tme.TokenType = 0xf;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11c,&tme);
    BackTokenMap[0xf] = 0x11c;
    tme.TokenType = 0x10;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11b,&tme);
    BackTokenMap[0x10] = 0x11b;
    tme.TokenType = 0x11;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11f,&tme);
    BackTokenMap[0x11] = 0x11f;
    tme.TokenType = 0x12;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x120,&tme);
    BackTokenMap[0x12] = 0x120;
    tme.TokenType = 0x13;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x121,&tme);
    BackTokenMap[0x13] = 0x121;
    tme.TokenType = 0x14;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3c,&tme);
    BackTokenMap[0x14] = 0x3c;
    tme.TokenType = 0x15;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3e,&tme);
    BackTokenMap[0x15] = 0x3e;
    tme.TokenType = 0x16;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11d,&tme);
    BackTokenMap[0x16] = 0x11d;
    tme.TokenType = 0x17;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11e,&tme);
    BackTokenMap[0x17] = 0x11e;
    tme.TokenType = 0x18;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x122,&tme);
    BackTokenMap[0x18] = 0x122;
    tme.TokenType = 0x19;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x178,&tme);
    BackTokenMap[0x19] = 0x178;
    tme.TokenType = 0x1a;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x109,&tme);
    BackTokenMap[0x1a] = 0x109;
    tme.TokenType = 0x75;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10a,&tme);
    BackTokenMap[0x75] = 0x10a;
    tme.TokenType = 0x1b;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x7c,&tme);
    BackTokenMap[0x1b] = 0x7c;
    tme.TokenType = 0x1c;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x5e,&tme);
    BackTokenMap[0x1c] = 0x5e;
    tme.TokenType = 0x1d;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x26,&tme);
    BackTokenMap[0x1d] = 0x26;
    tme.TokenType = 0x1e;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x118,&tme);
    BackTokenMap[0x1e] = 0x118;
    tme.TokenType = 0x1f;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x116,&tme);
    BackTokenMap[0x1f] = 0x116;
    tme.TokenType = 0x20;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x117,&tme);
    BackTokenMap[0x20] = 0x117;
    tme.TokenType = 0x21;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2d,&tme);
    BackTokenMap[0x21] = 0x2d;
    tme.TokenType = 0x22;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2b,&tme);
    BackTokenMap[0x22] = 0x2b;
    tme.TokenType = 0x23;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2a,&tme);
    BackTokenMap[0x23] = 0x2a;
    tme.TokenType = 0x24;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2f,&tme);
    BackTokenMap[0x24] = 0x2f;
    tme.TokenType = 0x25;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x25,&tme);
    BackTokenMap[0x25] = 0x25;
    tme.TokenType = 0x26;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x167,&tme);
    BackTokenMap[0x26] = 0x167;
    tme.TokenType = 0x27;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x166,&tme);
    BackTokenMap[0x27] = 0x166;
    tme.TokenType = 0x28;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x123,&tme);
    BackTokenMap[0x28] = 0x123;
    tme.TokenType = 0x2a;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x119,&tme);
    BackTokenMap[0x2a] = 0x119;
    tme.TokenType = 0x2b;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11a,&tme);
    BackTokenMap[0x2b] = 0x11a;
    tme.TokenType = 0x2c;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2e,&tme);
    BackTokenMap[0x2c] = 0x2e;
    tme.TokenType = 0x2d;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x28,&tme);
    BackTokenMap[0x2d] = 0x28;
    tme.TokenType = 0x43;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x29,&tme);
    BackTokenMap[0x43] = 0x29;
    tme.TokenType = 0x2f;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x108,&tme);
    BackTokenMap[0x2f] = 0x108;
    tme.TokenType = 0x31;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3b,&tme);
    BackTokenMap[0x31] = 0x3b;
    tme.TokenType = 0x32;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2c,&tme);
    BackTokenMap[0x32] = 0x2c;
    tme.TokenType = 0x35;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x146,&tme);
    BackTokenMap[0x35] = 0x146;
    tme.TokenType = 0x37;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14e,&tme);
    BackTokenMap[0x37] = 0x14e;
    tme.TokenType = 0x38;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x158,&tme);
    BackTokenMap[0x38] = 0x158;
    tme.TokenType = 0x39;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x125,&tme);
    BackTokenMap[0x39] = 0x125;
    tme.TokenType = 0x3a;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x179,&tme);
    BackTokenMap[0x3a] = 0x179;
    tme.TokenType = 0x6c;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x15d,&tme);
    BackTokenMap[0x6c] = 0x15d;
    tme.TokenType = 0x6d;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x165,&tme);
    BackTokenMap[0x6d] = 0x165;
    tme.TokenType = 0x6e;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x164,&tme);
    BackTokenMap[0x6e] = 0x164;
    tme.TokenType = 0x6f;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x16a,&tme);
    BackTokenMap[0x6f] = 0x16a;
    tme.TokenType = 0x73;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x171,&tme);
    BackTokenMap[0x73] = 0x171;
    tme.TokenType = 0x74;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x172,&tme);
    BackTokenMap[0x74] = 0x172;
    tme.TokenType = 0x70;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x160,&tme);
    BackTokenMap[0x70] = 0x160;
    tme.TokenType = 0x71;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x185,&tme);
    BackTokenMap[0x71] = 0x185;
    tme.TokenType = 0x72;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x186,&tme);
    BackTokenMap[0x72] = 0x186;
    tme.TokenType = 99;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x187,&tme);
    BackTokenMap[99] = 0x187;
    tme.TokenType = 0x3d;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x7b,&tme);
    BackTokenMap[0x3d] = 0x7b;
    tme.TokenType = 0x3e;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x7d,&tme);
    BackTokenMap[0x3e] = 0x7d;
    tme.TokenType = 0x3f;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x145,&tme);
    BackTokenMap[0x3f] = 0x145;
    tme.TokenType = 0x41;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x147,&tme);
    BackTokenMap[0x41] = 0x147;
    tme.TokenType = 0x53;
    tme.TokenName = 0x24a;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x139,&tme);
    BackTokenMap[0x53] = 0x139;
    tme.TokenType = 0x54;
    tme.TokenName = 0x24b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x138,&tme);
    BackTokenMap[0x54] = 0x138;
    tme.TokenType = 0x55;
    tme.TokenName = 0x24c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13a,&tme);
    BackTokenMap[0x55] = 0x13a;
    tme.TokenType = 0x56;
    tme.TokenName = 0x24d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13b,&tme);
    BackTokenMap[0x56] = 0x13b;
    tme.TokenType = 0x53;
    tme.TokenName = 0x252;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13c,&tme);
    BackTokenMap[0x53] = 0x13c;
    tme.TokenType = 0x54;
    tme.TokenName = 0x251;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13d,&tme);
    BackTokenMap[0x54] = 0x13d;
    tme.TokenType = 0x55;
    tme.TokenName = 0x254;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13e,&tme);
    BackTokenMap[0x55] = 0x13e;
    tme.TokenType = 0x56;
    tme.TokenName = 0x253;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13f,&tme);
    BackTokenMap[0x56] = 0x13f;
    tme.TokenType = 0x57;
    tme.TokenName = 0x24e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x140,&tme);
    BackTokenMap[0x57] = 0x140;
    tme.TokenType = 0x58;
    tme.TokenName = 0x24f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x141,&tme);
    BackTokenMap[0x58] = 0x141;
    tme.TokenType = 0x59;
    tme.TokenName = 0x250;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x133,&tme);
    BackTokenMap[0x59] = 0x133;
    tme.TokenType = 0x5a;
    tme.TokenName = 0x255;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x134,&tme);
    BackTokenMap[0x5a] = 0x134;
    tme.TokenType = 0x5b;
    tme.TokenName = 600;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x136,&tme);
    BackTokenMap[0x5b] = 0x136;
    tme.TokenType = 0x5c;
    tme.TokenName = 0x259;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x149,&tme);
    BackTokenMap[0x5c] = 0x149;
    tme.TokenType = 0x5d;
    tme.TokenName = 0x261;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17a,&tme);
    BackTokenMap[0x5d] = 0x17a;
    tme.TokenType = 0x5e;
    tme.TokenName = 0x262;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17b,&tme);
    BackTokenMap[0x5e] = 0x17b;
    tme.TokenType = 0x5f;
    tme.TokenName = 0x1ea;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x148,&tme);
    BackTokenMap[0x5f] = 0x148;
    tme.TokenType = 100;
    tme.TokenName = 0x25b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17c,&tme);
    BackTokenMap[100] = 0x17c;
    tme.TokenType = 0x65;
    tme.TokenName = 0x25c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17d,&tme);
    BackTokenMap[0x65] = 0x17d;
    tme.TokenType = 0x33;
    tme.TokenName = 0x25d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x177,&tme);
    BackTokenMap[0x33] = 0x177;
    tme.TokenType = 0x66;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x144,&tme);
    BackTokenMap[0x66] = 0x144;
    tme.TokenType = 0x82;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x150,&tme);
    BackTokenMap[0x82] = 0x150;
    tme.TokenType = 0x81;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x151,&tme);
    BackTokenMap[0x81] = 0x151;
    tme.TokenType = 0x2e;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x5b,&tme);
    BackTokenMap[0x2e] = 0x5b;
    tme.TokenType = 0x6b;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x5d,&tme);
    BackTokenMap[0x6b] = 0x5d;
    tme.TokenType = 0x76;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17e,&tme);
    BackTokenMap[0x76] = 0x17e;
    tme.TokenType = 0x77;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x15a,&tme);
    BackTokenMap[0x77] = 0x15a;
    tme.TokenType = 0x78;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x16f,&tme);
    BackTokenMap[0x78] = 0x16f;
    tme.TokenType = 0x4a;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x173,&tme);
    BackTokenMap[0x4a] = 0x173;
    tme.TokenType = 0x83;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x174,&tme);
    BackTokenMap[0x83] = 0x174;
    tme.TokenType = 0x79;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x7e,&tme);
    BackTokenMap[0x79] = 0x7e;
    tme.TokenType = 0x7a;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x21,&tme);
    BackTokenMap[0x7a] = 0x21;
    tme.TokenType = 0x7b;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17f,&tme);
    BackTokenMap[0x7b] = 0x17f;
    tme.TokenType = 0x7c;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x180,&tme);
    BackTokenMap[0x7c] = 0x180;
    tme.TokenType = 0x84;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x129,&tme);
    BackTokenMap[0x84] = 0x129;
    tme.TokenType = 0x85;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x126,&tme);
    BackTokenMap[0x85] = 0x126;
    tme.TokenType = 0x86;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x12f,&tme);
    BackTokenMap[0x86] = 0x12f;
    tme.TokenType = 0x87;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,299,&tme);
    BackTokenMap[0x87] = 299;
    tme.TokenType = 0x88;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x12d,&tme);
    BackTokenMap[0x88] = 0x12d;
    tme.TokenType = 0x89;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x132,&tme);
    BackTokenMap[0x89] = 0x132;
    tme.TokenType = 0x8a;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x131,&tme);
    BackTokenMap[0x8a] = 0x131;
    tme.TokenType = 0x8b;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x12e,&tme);
    BackTokenMap[0x8b] = 0x12e;
    tme.TokenType = 0x8c;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,300,&tme);
    BackTokenMap[0x8c] = 300;
    tme.TokenType = 0x8d;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x130,&tme);
    BackTokenMap[0x8d] = 0x130;
    tme.TokenType = 0x8e;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x127,&tme);
    BackTokenMap[0x8e] = 0x127;
    tme.TokenType = 0x3b;
    tme.TokenName = 0x249;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x12a,&tme);
    BackTokenMap[0x3b] = 0x12a;
    tme.TokenType = 0x40;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x128,&tme);
    BackTokenMap[0x40] = 0x128;
    tme.TokenType = 0x45;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x176,&tme);
    BackTokenMap[0x45] = 0x176;
    tme.TokenType = 0x46;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x184,&tme);
    BackTokenMap[0x46] = 0x184;
    tme.TokenType = 0x47;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x183,&tme);
    BackTokenMap[0x47] = 0x183;
    tme.TokenType = 0x48;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x182,&tme);
    BackTokenMap[0x48] = 0x182;
    tme.TokenType = 0x49;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14d,&tme);
    BackTokenMap[0x49] = 0x14d;
    tme.TokenType = 0x42;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x181,&tme);
    BackTokenMap[0x42] = 0x181;
    tme.TokenType = 0x61;
    tme.TokenName = 0x25f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14b,&tme);
    BackTokenMap[0x61] = 0x14b;
    tme.TokenType = 0x3c;
    tme.TokenName = 0x204;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14c,&tme);
    BackTokenMap[0x3c] = 0x14c;
    tme.TokenType = 0x60;
    tme.TokenName = 0x25e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14a,&tme);
    BackTokenMap[0x60] = 0x14a;
    tme.TokenType = 0x62;
    tme.TokenName = 0x263;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,399,&tme);
    BackTokenMap[0x62] = 399;
    tme.TokenType = 0x36;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x101,&tme);
    BackTokenMap[0x36] = 0x101;
    tme.TokenType = 0x52;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x102,&tme);
    BackTokenMap[0x52] = 0x102;
    tme.TokenType = 0x80;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x103,&tme);
    BackTokenMap[0x80] = 0x103;
    tme.TokenType = 0x7d;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x104,&tme);
    BackTokenMap[0x7d] = 0x104;
    tme.TokenType = 0x7e;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x105,&tme);
    BackTokenMap[0x7e] = 0x105;
    tme.TokenType = 0x7f;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x106,&tme);
    BackTokenMap[0x7f] = 0x106;
    tme.TokenType = 0x44;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x107,&tme);
    BackTokenMap[0x44] = 0x107;
    tme.TokenType = 0x4b;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18e,&tme);
    BackTokenMap[0x4b] = 0x18e;
    tme.TokenType = 0x4d;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18d,&tme);
    BackTokenMap[0x4d] = 0x18d;
    tme.TokenType = 0x4c;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x189,&tme);
    BackTokenMap[0x4c] = 0x189;
    tme.TokenType = 0x4e;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18b,&tme);
    BackTokenMap[0x4e] = 0x18b;
    tme.TokenType = 0x50;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18c,&tme);
    BackTokenMap[0x50] = 0x18c;
    tme.TokenType = 0x4f;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x188,&tme);
    BackTokenMap[0x4f] = 0x188;
    tme.TokenType = 0x51;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18a,&tme);
    BackTokenMap[0x51] = 0x18a;
    tme.TokenType = 0x34;
    tme.TokenName = 0;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x162,&tme);
    BackTokenMap[0x34] = 0x162;
  }
  ZCC_InitOperators();
  ZCC_InitConversions();
  lastlump = 0;
  FScriptPosition::WarnCounter = 0;
  FScriptPosition::ErrorCounter = 0;
  do {
    pZVar4 = (ZCCParseState *)0x0;
    lump = FWadCollection::FindLump(&Wads,"ZSCRIPT",&lastlump,false);
    if (lump == 0xffffffff) {
      Printf("\x1cTWARNING!!!\n");
      Printf(
            "\x1cTAs of this version, Zscript is still considered a feature in development which can change \x1cGWITHOUT WARNING!!!\n"
            );
      Printf("\x1cTUse at your own risk!\n");
      return;
    }
    FScanner::FScanner(&sc);
    yyp = (long *)malloc(0x12d8);
    if (yyp != (long *)0x0) {
      *(undefined4 *)(yyp + 1) = 0xffffffff;
      *yyp = (long)(yyp + 3);
      *(undefined2 *)(yyp + 3) = 0;
      *(undefined1 *)((long)yyp + 0x1a) = 0;
    }
    ZCC_AST::ZCC_AST((ZCC_AST *)&tme);
    __filename = DArgs::CheckValue(Args,"-tracefile");
    if (__filename == (char *)0x0) {
      pFVar3 = (FILE *)0x0;
    }
    else {
      pFVar3 = fopen(__filename,"w");
      pZVar4 = (ZCCParseState *)&cc;
      yyTraceFILE = (FILE *)pFVar3;
      yyTracePrompt = (char *)pFVar3;
      if (pFVar3 != (FILE *)0x0) {
        yyTracePrompt = (char *)pZVar4;
      }
    }
    FScanner::OpenLumpNum(&sc,lump);
    local_a00 = pFVar3;
    FScanner::SavePos(&sc);
    ParseSingleFile((char *)(ulong)lump,(int)yyp,&tme,pZVar4);
    lVar7 = 0;
    lVar6 = 0;
    for (uVar5 = 0; uVar5 < Includes.Count; uVar5 = uVar5 + 1) {
      pZVar4 = (ZCCParseState *)0x0;
      lump = FWadCollection::CheckNumForFullName
                       (&Wads,(FString *)((long)&(Includes.Array)->Chars + lVar6),true,0);
      if (lump == 0xffffffff) {
        FScriptPosition::Message
                  ((FScriptPosition *)((long)&((IncludeLocs.Array)->FileName).Chars + lVar7),2,
                   "Include script lump %s not found");
      }
      else {
        ParseSingleFile((char *)(ulong)lump,(int)yyp,&tme,pZVar4);
      }
      lVar6 = lVar6 + 8;
      lVar7 = lVar7 + 0x10;
    }
    TArray<FString,_FString>::Clear(&Includes);
    TArray<FString,_FString>::ShrinkToFit(&Includes);
    TArray<FScriptPosition,_FScriptPosition>::Clear(&IncludeLocs);
    TArray<FScriptPosition,_FScriptPosition>::ShrinkToFit(&IncludeLocs);
    iVar2 = FScanner::GetMessageLine(&sc);
    yyminor.SourceLoc = iVar2;
    yyminor.field_0.Float = 2.12199579047121e-314;
    yyminor._12_4_ = 0;
    ZCCParse(yyp,0,yyminor,(ZCCParseState *)&tme);
    ZCCParseFree(yyp,free);
    pFVar3 = local_a00;
    iVar2 = FScriptPosition::ErrorCounter;
    if (0 < FScriptPosition::ErrorCounter) {
      FWadCollection::GetLumpFullPath((FWadCollection *)&cc,0x1c6a4b0);
      I_Error("%d errors while parsing %s",(ulong)(uint)iVar2,cc._0_8_);
      FString::~FString((FString *)&cc);
    }
    if (pFVar3 != (FILE *)0x0) {
      fclose(pFVar3);
    }
    iVar2 = DArgs::CheckParm(Args,"-dumpast",1);
    if (iVar2 != 0) {
      ZCC_PrintAST((ZCC_TreeNode *)&cc);
      FWadCollection::GetLumpFullPath((FWadCollection *)&symtable,0x1c6a4b0);
      FString::ReplaceChars((FString *)&symtable,":\\/?|",'.');
      FString::operator+=((FString *)&symtable,".ast");
      pFVar3 = fopen((char *)symtable.ParentSymbolTable,"w");
      if (pFVar3 != (FILE *)0x0) {
        fputs((char *)cc._0_8_,pFVar3);
        fclose(pFVar3);
      }
      FString::~FString((FString *)&symtable);
      FString::~FString((FString *)&cc);
    }
    PSymbolTable::PSymbolTable(&symtable);
    ZCCCompiler::ZCCCompiler(&cc,(ZCC_AST *)&tme,(DObject *)0x0,&symtable,&GlobalSymbols,lump);
    ZCCCompiler::Compile(&cc);
    iVar2 = FScriptPosition::WarnCounter;
    uVar5 = (ulong)(uint)FScriptPosition::ErrorCounter;
    if (FScriptPosition::ErrorCounter < 1) {
      if (0 < FScriptPosition::WarnCounter) {
        FWadCollection::GetLumpFullPath((FWadCollection *)local_a10,0x1c6a4b0);
        Printf("\x1cI%d warnings while compiling %s",(ulong)(uint)iVar2,local_a10._0_8_);
        goto LAB_005440af;
      }
    }
    else {
      FWadCollection::GetLumpFullPath((FWadCollection *)local_a10,0x1c6a4b0);
      I_Error("%d errors, %d warnings while compiling %s",uVar5,(ulong)(uint)iVar2);
LAB_005440af:
      FString::~FString((FString *)local_a10);
    }
    ZCCCompiler::~ZCCCompiler(&cc);
    PSymbolTable::~PSymbolTable(&symtable);
    ZCC_AST::~ZCC_AST((ZCC_AST *)&tme);
    FScanner::~FScanner(&sc);
    iVar2 = DArgs::CheckParm(Args,"-zscript",1);
    if (iVar2 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void ParseScripts()
{
	if (TokenMap.CountUsed() == 0)
	{
		InitTokenMap();
	}
	ZCC_InitOperators();
	ZCC_InitConversions();

	int lump, lastlump = 0;
	FScriptPosition::ResetErrorCounter();

	while ((lump = Wads.FindLump("ZSCRIPT", &lastlump)) != -1)
	{
		DoParse(lump);
		if (!Args->CheckParm("-zscript"))
		{
			return;
		}
	}
	Printf(TEXTCOLOR_PURPLE "WARNING!!!\n");
	Printf(TEXTCOLOR_PURPLE "As of this version, Zscript is still considered a feature in development which can change " TEXTCOLOR_RED "WITHOUT WARNING!!!\n");
	Printf(TEXTCOLOR_PURPLE "Use at your own risk!\n");

}